

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGTextFragmentsBuilder::handleElement
          (SVGTextFragmentsBuilder *this,SVGTextPositioningElement *element)

{
  bool bVar1;
  uint uVar2;
  SVGNodeList *this_00;
  reference this_01;
  pointer pSVar3;
  SVGTextNode *node;
  SVGTextPositioningElement *element_00;
  reference pvVar4;
  size_type sVar5;
  value_type *position;
  unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *child;
  const_iterator __end1;
  const_iterator __begin1;
  SVGNodeList *__range1;
  size_type local_28;
  size_type local_20;
  size_type itemIndex;
  SVGTextPositioningElement *element_local;
  SVGTextFragmentsBuilder *this_local;
  
  itemIndex = (size_type)element;
  element_local = (SVGTextPositioningElement *)this;
  local_20 = std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>::size
                       (&this->m_textPositions);
  local_28 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::length
                       (this->m_text);
  __range1 = (SVGNodeList *)
             std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::length
                       (this->m_text);
  std::vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>>::
  emplace_back<lunasvg::SVGTextPositioningElement_const*&,unsigned_long,unsigned_long>
            ((vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>> *)
             &this->m_textPositions,(SVGTextPositioningElement **)&itemIndex,&local_28,
             (unsigned_long *)&__range1);
  this_00 = SVGElement::children_abi_cxx11_((SVGElement *)itemIndex);
  __end1 = std::__cxx11::
           list<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
           ::begin(this_00);
  child = (unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *)
          std::__cxx11::
          list<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
          ::end(this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&child), bVar1) {
    this_01 = std::
              _List_const_iterator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>
              ::operator*(&__end1);
    pSVar3 = std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>::operator->
                       (this_01);
    uVar2 = (*pSVar3->_vptr_SVGNode[2])();
    if ((uVar2 & 1) == 0) {
      pSVar3 = std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>::operator->
                         (this_01);
      uVar2 = (*pSVar3->_vptr_SVGNode[7])();
      if ((uVar2 & 1) != 0) {
        pSVar3 = std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>::get
                           (this_01);
        element_00 = toSVGTextPositioningElement(pSVar3);
        handleElement(this,element_00);
      }
    }
    else {
      pSVar3 = std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>::get
                         (this_01);
      node = toSVGTextNode(pSVar3);
      handleText(this,node);
    }
    std::
    _List_const_iterator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>
    ::operator++(&__end1);
  }
  pvVar4 = std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>::
           operator[](&this->m_textPositions,local_20);
  if (pvVar4->node != (SVGNode *)itemIndex) {
    __assert_fail("position.node == element",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                  ,0x144,
                  "void lunasvg::SVGTextFragmentsBuilder::handleElement(const SVGTextPositioningElement *)"
                 );
  }
  sVar5 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::length
                    (this->m_text);
  pvVar4->endOffset = sVar5;
  return;
}

Assistant:

void SVGTextFragmentsBuilder::handleElement(const SVGTextPositioningElement* element)
{
    const auto itemIndex = m_textPositions.size();
    m_textPositions.emplace_back(element, m_text.length(), m_text.length());
    for(const auto& child : element->children()) {
        if(child->isTextNode()) {
            handleText(toSVGTextNode(child.get()));
        } else if(child->isTextPositioningElement()) {
            handleElement(toSVGTextPositioningElement(child.get()));
        }
    }

    auto& position = m_textPositions[itemIndex];
    assert(position.node == element);
    position.endOffset = m_text.length();
}